

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radiobox.cpp
# Opt level: O0

void __thiscall ftxui::anon_unknown_3::RadioboxBase::~RadioboxBase(RadioboxBase *this)

{
  RadioboxBase *this_local;
  
  (this->super_ComponentBase)._vptr_ComponentBase = (_func_int **)&PTR__RadioboxBase_002195d8;
  Ref<ftxui::RadioboxOption>::~Ref(&this->option_);
  std::vector<ftxui::Box,_std::allocator<ftxui::Box>_>::~vector(&this->boxes_);
  ComponentBase::~ComponentBase(&this->super_ComponentBase);
  return;
}

Assistant:

RadioboxBase(ConstStringListRef entries,
               int* selected,
               Ref<RadioboxOption> option)
      : entries_(entries), selected_(selected), option_(std::move(option)) {
#if defined(FTXUI_MICROSOFT_TERMINAL_FALLBACK)
    // Microsoft terminal do not use fonts able to render properly the default
    // radiobox glyph.
    if (option_->style_checked == "◉ ")
      option_->style_checked = "(*)";
    if (option_->style_unchecked == "○ ")
      option_->style_unchecked = "( )";
#endif
  }